

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O0

bool_t prf_state_texture_lookup(prf_state_t *state,uint index,prf_texture_t *texture)

{
  void *__src;
  int iVar1;
  void *in_RDX;
  int in_ESI;
  long in_RDI;
  prf_texture_t *tex;
  prf_node_t *node;
  int i;
  int count;
  int local_28;
  
  iVar1 = prf_array_count((void *)0x107360);
  local_28 = 0;
  while( true ) {
    if (iVar1 <= local_28) {
      return 0;
    }
    __src = *(void **)(*(long *)(*(long *)(in_RDI + 0x38) + (long)local_28 * 8) + 8);
    if (*(int *)((long)__src + 200) == in_ESI) break;
    local_28 = local_28 + 1;
  }
  memcpy(in_RDX,__src,0xd4);
  return 1;
}

Assistant:

bool_t
prf_state_texture_lookup(
    prf_state_t * state,
    unsigned int index,
    prf_texture_t * texture )
{
    int count, i;
    assert( state != NULL && texture != NULL );
    count = prf_array_count( state->textures );
    for ( i = 0; i < count; i++ ) {
        prf_node_t *node;
        prf_texture_t *tex;
        node = state->textures[i];
        tex = (prf_texture_t *) node->data;
        if ( (unsigned int) tex->pattern_index == index ) {
            memcpy(texture, tex, sizeof( prf_texture_t ) );
            return TRUE;
        }
    }
    return FALSE;
}